

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmark.cpp
# Opt level: O1

void __thiscall QBenchmarkGlobalData::QBenchmarkGlobalData(QBenchmarkGlobalData *this)

{
  QBenchmarkMeasurerBase *pQVar1;
  
  (this->context).tag.d.d = (Data *)0x0;
  (this->context).tag.d.ptr = (char16_t *)0x0;
  (this->context).slotName.d.ptr = (char16_t *)0x0;
  (this->context).slotName.d.size = 0;
  this->measurer = (QBenchmarkMeasurerBase *)0x0;
  (this->context).slotName.d.d = (Data *)0x0;
  (this->context).tag.d.size = 0;
  (this->context).checkpointIndex = -1;
  this->walltimeMinimum = -1;
  this->iterationCount = -1;
  this->medianIterationCount = -1;
  this->createChart = false;
  this->verboseOutput = false;
  (this->callgrindOutFileBase).d.d = (Data *)0x0;
  (this->callgrindOutFileBase).d.ptr = (char16_t *)0x0;
  (this->callgrindOutFileBase).d.size = 0;
  this->minimumTotal = -1;
  this->mode_ = WallTime;
  pQVar1 = createMeasurer(this);
  this->measurer = pQVar1;
  return;
}

Assistant:

QBenchmarkGlobalData::QBenchmarkGlobalData()
{
    setMode(mode_);
}